

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O2

bool GenerateFineGeometryCuttingPlane
               (vector3 *start_vertex,vector3 *end_vertex,double half_offset_distance,
               double *param_4,double last_half_offset_distance,double *last_local_layer_height,
               double *cylinder_height,bool has_cutting_plane,CuttingPlane *cutting_plane,
               fstream *out)

{
  double *pdVar1;
  bool bVar2;
  ostream *poVar3;
  undefined4 uVar4;
  undefined8 unaff_RBX;
  ostream *poVar5;
  undefined3 in_register_00000089;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar12;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar13;
  double dVar14;
  double distance_tolerance;
  double local_1a8;
  double dStack_1a0;
  vector3 local_198;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  undefined8 uStack_150;
  double local_140;
  double *local_138;
  double local_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  double dStack_d0;
  vector3 local_c8;
  vector3 local_a8;
  vector3 local_88;
  vector3 local_68;
  vector3 local_48;
  
  local_130 = 1.5;
  if (CONCAT31(in_register_00000089,has_cutting_plane) == 0) {
    uVar4 = 0;
  }
  else {
    bVar2 = CuttingPlane::DeviationFromPlane(cutting_plane,start_vertex,end_vertex,&local_130);
    uVar4 = (undefined4)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
    if (bVar2) {
      bVar2 = CuttingPlane::OnPlanePositive(cutting_plane,start_vertex,end_vertex);
      uVar4 = 0;
      if (!bVar2) {
        return false;
      }
    }
  }
  local_158 = end_vertex->z;
  local_d8 = start_vertex->x;
  dStack_d0 = start_vertex->y;
  local_168 = end_vertex->x;
  dStack_160 = end_vertex->y;
  dVar8 = local_168 - local_d8;
  dVar12 = dStack_160 - dStack_d0;
  auVar6._0_8_ = SQRT(dVar12 * dVar12 + dVar8 * dVar8);
  auVar10._8_8_ = -dVar8;
  auVar10._0_8_ = dVar12;
  auVar6._8_8_ = auVar6._0_8_;
  auVar11 = divpd(auVar10,auVar6);
  local_f8 = auVar11._0_8_ * half_offset_distance;
  dStack_f0 = auVar11._8_8_ * half_offset_distance;
  local_108 = local_d8 + local_f8;
  dStack_100 = dStack_d0 + dStack_f0;
  local_f8 = local_f8 + local_168;
  dStack_f0 = dStack_f0 + dStack_160;
  local_178 = -auVar11._0_8_ * half_offset_distance;
  dStack_170 = -auVar11._8_8_ * half_offset_distance;
  local_d8 = local_d8 + local_178;
  dStack_d0 = dStack_d0 + dStack_170;
  local_48.x = local_f8 - local_108;
  local_48.y = dStack_f0 - dStack_100;
  local_118 = (0.0 / auVar6._0_8_) * half_offset_distance;
  dStack_110 = -(0.0 / auVar6._0_8_) * half_offset_distance;
  uStack_150 = 0;
  local_e8 = start_vertex->z + local_118;
  local_128 = local_158 + local_118;
  dStack_120 = start_vertex->z + dStack_110;
  uStack_e0 = 0;
  local_48.z = local_128 - local_e8;
  dVar12 = *param_4 * 0.5;
  dVar9 = *last_local_layer_height * 0.5;
  auVar11._8_8_ =
       (dStack_120 - local_e8) * (dStack_120 - local_e8) +
       (local_d8 - local_108) * (local_d8 - local_108) +
       (dStack_d0 - dStack_100) * (dStack_d0 - dStack_100);
  auVar11._0_8_ = local_48.z * local_48.z + local_48.x * local_48.x + local_48.y * local_48.y;
  auVar11 = sqrtpd(ZEXT816(0x3fe0000000000000),auVar11);
  local_140 = vector3::GetZAngle(&local_48);
  local_68.z = (start_vertex->z + end_vertex->z) * 0.5;
  local_68.x = (start_vertex->x + end_vertex->x) * 0.5;
  local_68.y = (start_vertex->y + end_vertex->y) * 0.5;
  local_1a8 = auVar11._0_8_;
  dStack_1a0 = auVar11._8_8_;
  local_88.x = local_1a8 * 0.5;
  dVar13 = dStack_1a0 * 0.5;
  local_88.z = 0.0;
  dVar8 = *param_4;
  local_a8.z = -dVar8;
  local_a8.x = local_1a8 * -0.5;
  local_a8.y = dStack_1a0 * -0.5;
  if (((((*last_local_layer_height == 0.0) && (!NAN(*last_local_layer_height))) && (dVar8 == 0.0))
      && (!NAN(dVar8))) ||
     ((dVar8 = start_vertex->x - end_vertex->x, dVar7 = start_vertex->y - end_vertex->y,
      dVar14 = start_vertex->z - end_vertex->z,
      dVar8 = SQRT(dVar14 * dVar14 + dVar8 * dVar8 + dVar7 * dVar7), dVar8 == 0.0 && (!NAN(dVar8))))
     ) {
    bVar2 = false;
  }
  else {
    local_168 = local_168 + local_178;
    dStack_160 = dStack_160 + dStack_170;
    local_158 = local_158 + dStack_110;
    local_178 = (double)CONCAT44(local_178._4_4_,uVar4);
    local_138 = param_4;
    local_88.y = dVar13;
    if ((char)uVar4 != '\0') {
      std::operator<<((ostream *)(out + 0x10),"intersection{\n");
      operator<<((ostream *)(out + 0x10),cutting_plane);
    }
    poVar5 = (ostream *)(out + 0x10);
    std::operator<<(poVar5,"union{\n");
    poVar3 = std::operator<<(poVar5,"cone\n{ ");
    local_198.z = local_e8 - dVar9;
    local_198.x = local_108;
    local_198.y = dStack_100;
    operator<<(poVar3,&local_198);
    std::operator<<(poVar3,",");
    poVar3 = std::ostream::_M_insert<double>(dVar9);
    poVar3 = std::operator<<(poVar3,"\n");
    local_c8.z = local_128 - dVar12;
    local_c8.x = local_f8;
    local_c8.y = dStack_f0;
    operator<<(poVar3,&local_c8);
    std::operator<<(poVar3,",");
    poVar3 = std::ostream::_M_insert<double>(dVar12);
    std::operator<<(poVar3,"\n}\n");
    poVar3 = std::operator<<(poVar5,"cone\n{ ");
    local_198.z = dStack_120 - dVar9;
    local_198.x = local_d8;
    local_198.y = dStack_d0;
    operator<<(poVar3,&local_198);
    std::operator<<(poVar3,",");
    poVar3 = std::ostream::_M_insert<double>(dVar9);
    poVar3 = std::operator<<(poVar3,"\n");
    local_c8.z = local_158 - dVar12;
    local_c8.x = local_168;
    local_c8.y = dStack_160;
    operator<<(poVar3,&local_c8);
    std::operator<<(poVar3,",");
    poVar3 = std::ostream::_M_insert<double>(dVar12);
    std::operator<<(poVar3,"\n}\n");
    poVar3 = std::operator<<(poVar5,"box\n{");
    operator<<(poVar3,&local_a8);
    poVar3 = std::operator<<(poVar3,",");
    operator<<(poVar3,&local_88);
    std::operator<<(poVar3,"\nrotate z*");
    poVar3 = std::ostream::_M_insert<double>(local_140);
    poVar3 = std::operator<<(poVar3,"\ntranslate ");
    operator<<(poVar3,&local_68);
    std::operator<<(poVar3,"\n}\n");
    if ((*last_local_layer_height != 0.0) || (NAN(*last_local_layer_height))) {
      std::operator<<(poVar5,"torus\n{");
      poVar3 = std::ostream::_M_insert<double>(dVar13);
      std::operator<<(poVar3,", ");
      poVar3 = std::ostream::_M_insert<double>(dVar9);
      poVar3 = std::operator<<(poVar3,"\nrotate x*90 \ntranslate ");
      local_198.z = start_vertex->z - dVar9;
      local_198.x = start_vertex->x;
      local_198.y = start_vertex->y;
      operator<<(poVar3,&local_198);
      std::operator<<(poVar3,"\n}\n");
      dVar9 = start_vertex->x - start_vertex->x;
      dVar7 = start_vertex->y - start_vertex->y;
      dVar8 = start_vertex->z - (start_vertex->z - *last_local_layer_height);
      dVar8 = SQRT(dVar8 * dVar8 + dVar9 * dVar9 + dVar7 * dVar7);
      if ((dVar8 != 0.0) || (NAN(dVar8))) {
        poVar3 = std::operator<<(poVar5,"cylinder\n{");
        local_198.z = start_vertex->z - *last_local_layer_height;
        local_198.x = start_vertex->x;
        local_198.y = start_vertex->y;
        operator<<(poVar3,&local_198);
        poVar3 = std::operator<<(poVar3,", ");
        operator<<(poVar3,start_vertex);
        std::operator<<(poVar3,",");
        poVar3 = std::ostream::_M_insert<double>(dVar13);
        std::operator<<(poVar3,"\n}\n");
      }
    }
    pdVar1 = local_138;
    if ((*local_138 != 0.0) || (NAN(*local_138))) {
      std::operator<<(poVar5,"torus\n{");
      poVar3 = std::ostream::_M_insert<double>(dVar13);
      std::operator<<(poVar3,", ");
      poVar3 = std::ostream::_M_insert<double>(dVar12);
      poVar3 = std::operator<<(poVar3,"\nrotate x*90 \ntranslate ");
      local_198.z = end_vertex->z - dVar12;
      local_198.x = end_vertex->x;
      local_198.y = end_vertex->y;
      operator<<(poVar3,&local_198);
      std::operator<<(poVar3,"\n}\n");
      dVar12 = end_vertex->x - end_vertex->x;
      dVar8 = end_vertex->y - end_vertex->y;
      dVar9 = end_vertex->z - (end_vertex->z - *pdVar1);
      dVar8 = SQRT(dVar9 * dVar9 + dVar12 * dVar12 + dVar8 * dVar8);
      if ((dVar8 != 0.0) || (NAN(dVar8))) {
        poVar3 = std::operator<<(poVar5,"cylinder\n{");
        local_198.z = end_vertex->z - *pdVar1;
        local_198.x = end_vertex->x;
        local_198.y = end_vertex->y;
        operator<<(poVar3,&local_198);
        poVar3 = std::operator<<(poVar3,", ");
        operator<<(poVar3,end_vertex);
        std::operator<<(poVar3,",");
        poVar3 = std::ostream::_M_insert<double>(dVar13);
        std::operator<<(poVar3,"\n}\n");
      }
    }
    if (local_178._0_1_ != '\0') {
      std::operator<<(poVar5,"}\n");
    }
    std::operator<<(poVar5,"texture{ GcodeTexture }\n");
    std::operator<<(poVar5,"}\n");
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool GenerateFineGeometryCuttingPlane(vector3 &start_vertex, vector3 &end_vertex, double half_offset_distance, const double &local_layer_height, double last_half_offset_distance, const double &last_local_layer_height, const double &cylinder_height, bool has_cutting_plane, CuttingPlane &cutting_plane, fstream &out)
{
  bool need_to_cut = false;
  double distance_tolerance = NOZZLE_DIAMETER;

  bool not_null = false;

  if (!has_cutting_plane)
  {
    need_to_cut = false;
  }
  else
  {
    if (cutting_plane.DeviationFromPlane(start_vertex, end_vertex, distance_tolerance))
    {
      if (cutting_plane.OnPlanePositive(start_vertex, end_vertex))
      {
        need_to_cut = false;
      }
      else
      {
        return not_null;
      }
    }
    else
    {
      need_to_cut = true;
    }
  }

  vector3 left_start, left_end, right_start, right_end;
  vector3 link_vertex = end_vertex - start_vertex;
  vector3 offset_vertex(link_vertex.y, -link_vertex.x, 0);
  offset_vertex.Uniform();

  left_start = start_vertex + offset_vertex * half_offset_distance;
  left_end = end_vertex + offset_vertex * half_offset_distance;

  offset_vertex.Reverse();
  right_start = start_vertex + offset_vertex * half_offset_distance;
  right_end = end_vertex + offset_vertex * half_offset_distance;

  //vector3 local_x_axis, local_y_axis;
  //local_x_axis = left_end - left_start;
  //local_y_axis = right_start - left_start;
  //local_x_axis.Uniform();
  //local_y_axis.Uniform();
  //vector3 local_origin = left_start.MoveDownRadius(local_layer_height);
  //vector3 corner_link = right_end - local_origin;
  //double local_x_coordinate = corner_link * local_x_axis;
  //double local_y_coordinate = corner_link * local_y_axis;
  double cone_bottom_radius = local_layer_height / 2;
  double cone_top_radius = last_local_layer_height / 2;
  //vector3 box_corner_vertex(local_x_coordinate, local_y_coordinate, local_layer_height);


  double x_length = (left_end - left_start).Length();
  double y_length = (right_start - left_start).Length();
  vector3 rotate_vector = left_end - left_start;
  //   double x_angle = rotate_vector.GetXAngle();
  //   double y_angle = rotate_vector.GetYAngle();
  double z_angle = rotate_vector.GetZAngle();
  vector3 target_center_point = (start_vertex + end_vertex) * 0.5;
  vector3 initial_box_right_corner(x_length / 2, y_length / 2, 0);
  vector3 initial_box_left_corner(-x_length / 2, -y_length / 2, -local_layer_height);

  if (last_local_layer_height == 0 && local_layer_height == 0)
  {
    return not_null;
  }

  if ((start_vertex - end_vertex).Length() == 0)
  {
    return not_null;
  }

  not_null = true;

  if (need_to_cut)
  {
    out << "intersection{\n";
    out << cutting_plane;
  }

  out << "union{\n";

  out << "cone\n\
{ " << left_start.MoveDownRadius(cone_top_radius) << "," << cone_top_radius << "\n" << left_end.MoveDownRadius(cone_bottom_radius) << "," << cone_bottom_radius << "\n\
}\n";

  out << "cone\n\
{ " << right_start.MoveDownRadius(cone_top_radius) << "," << cone_top_radius << "\n" << right_end.MoveDownRadius(cone_bottom_radius) << "," << cone_bottom_radius << "\n\
}\n";

  out << "box\n\
{" << initial_box_left_corner << "," << initial_box_right_corner << "\n\
rotate z*" << z_angle << "\n\
translate " << target_center_point << "\n\
}\n";

  if (last_local_layer_height != 0)
  {
    out << "torus\n\
{" << y_length / 2 << ", " << cone_top_radius << "\n\
rotate x*90 \n\
translate " << (start_vertex).MoveDownRadius(cone_top_radius) << "\n\
}\n";

    vector3 temp = (start_vertex).MoveDownRadius(last_local_layer_height);
    if ((start_vertex - temp).Length() != 0)
    {
      out << "cylinder\n\
{" << (start_vertex).MoveDownRadius(last_local_layer_height) << ", " << (start_vertex) << "," << y_length / 2 << "\n\
}\n";
    }
  }

  if (local_layer_height != 0)
  {
    out << "torus\n\
{" << y_length / 2 << ", " << cone_bottom_radius << "\n\
rotate x*90 \n\
translate " << (end_vertex).MoveDownRadius(cone_bottom_radius) << "\n\
}\n";

    vector3 temp = (end_vertex).MoveDownRadius(local_layer_height);
    if ((end_vertex - temp).Length() != 0)
    {
      out << "cylinder\n\
{" << (end_vertex).MoveDownRadius(local_layer_height) << ", " << (end_vertex) << "," << y_length / 2 << "\n\
}\n";
    }
  }

  if (need_to_cut)
  {
    out << "}\n";
  }

  out << "texture{ GcodeTexture }\n";
  out << "}\n";

  return not_null;
}